

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

double Catch::Benchmark::Detail::erfc_inv(double x)

{
  double dVar1;
  double x_local;
  
  dVar1 = anon_unknown_12::erf_inv(1.0 - x);
  return dVar1;
}

Assistant:

double erfc_inv(double x) {
                return erf_inv(1.0 - x);
            }